

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  ulong uVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  double dVar2;
  float logMax;
  int i_1;
  int offset_1;
  int l_1;
  float oneOverMax;
  int i;
  int offset;
  int l;
  int patternOffset;
  float max;
  int k;
  bool useLogScalars;
  int local_50;
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  int local_38;
  float local_30;
  int local_2c;
  
  uVar1 = *(ulong *)(in_RDI + 0x58);
  for (local_2c = 0; local_2c < *(int *)(in_RDI + 0x14); local_2c = local_2c + 1) {
    local_30 = 0.0;
    for (local_38 = 0; local_38 < *(int *)(in_RDI + 0x34); local_38 = local_38 + 1) {
      local_3c = local_38 * *(int *)(in_RDI + 0x18) * 4 + local_2c * 4;
      for (local_40 = 0; local_40 < 4; local_40 = local_40 + 1) {
        if (local_30 < *(float *)(in_RSI + (long)local_3c * 4)) {
          local_30 = *(float *)(in_RSI + (long)local_3c * 4);
        }
        local_3c = local_3c + 1;
      }
    }
    if ((local_30 == 0.0) && (!NAN(local_30))) {
      local_30 = 1.0;
    }
    for (local_48 = 0; local_48 < *(int *)(in_RDI + 0x34); local_48 = local_48 + 1) {
      local_4c = local_48 * *(int *)(in_RDI + 0x18) * 4 + local_2c * 4;
      for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
        *(float *)(in_RSI + (long)local_4c * 4) =
             (1.0 / local_30) * *(float *)(in_RSI + (long)local_4c * 4);
        local_4c = local_4c + 1;
      }
    }
    if ((uVar1 & 0x400) == 0) {
      *(float *)(in_RDX + (long)local_2c * 4) = local_30;
      if (in_RCX != 0) {
        dVar2 = log((double)local_30);
        *(float *)(in_RCX + (long)local_2c * 4) =
             (float)((double)*(float *)(in_RCX + (long)local_2c * 4) + dVar2);
      }
    }
    else {
      dVar2 = log((double)local_30);
      *(float *)(in_RDX + (long)local_2c * 4) = (float)dVar2;
      if (in_RCX != 0) {
        *(float *)(in_RCX + (long)local_2c * 4) =
             (float)dVar2 + *(float *)(in_RCX + (long)local_2c * 4);
      }
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}